

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

int run_test_getaddrinfo_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  undefined8 uVar3;
  uv_getaddrinfo_t *puVar4;
  undefined4 *puVar5;
  int *piVar6;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  undefined8 unaff_RBX;
  size_t *psVar7;
  undefined8 *puVar8;
  int *piVar9;
  long lVar10;
  uv_getaddrinfo_t req;
  undefined1 auStack_210 [144];
  undefined8 uStack_180;
  code *pcStack_170;
  code *pcStack_168;
  code *pcStack_160;
  undefined1 auStack_158 [144];
  undefined8 uStack_c8;
  code *pcStack_b8;
  code *pcStack_b0;
  undefined1 auStack_a8 [160];
  
  iVar2 = (int)auStack_a8;
  pcStack_b0 = (code *)0x15b519;
  uVar3 = uv_default_loop();
  pcStack_b0 = (code *)0x15b533;
  iVar1 = uv_getaddrinfo(uVar3,auStack_a8,abort,0,0,0);
  if (iVar1 == -0x16) {
    pcStack_b0 = (code *)0x15b541;
    uVar3 = uv_default_loop();
    pcStack_b0 = (code *)0x15b560;
    iVar2 = (int)auStack_a8;
    iVar1 = uv_getaddrinfo(uVar3,auStack_a8,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar1 != 0) goto LAB_0015b5c4;
    pcStack_b0 = (code *)0x15b569;
    uVar3 = uv_default_loop();
    iVar2 = 0;
    pcStack_b0 = (code *)0x15b573;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0015b5c9;
    if (fail_cb_called != 1) goto LAB_0015b5ce;
    pcStack_b0 = (code *)0x15b585;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x15b599;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    pcStack_b0 = (code *)0x15b5a3;
    uv_run(unaff_RBX);
    pcStack_b0 = (code *)0x15b5a8;
    uVar3 = uv_default_loop();
    pcStack_b0 = (code *)0x15b5b0;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x15b5c4;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b5c4:
    pcStack_b0 = (code *)0x15b5c9;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b5c9:
    pcStack_b0 = (code *)0x15b5ce;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b5ce:
    pcStack_b0 = (code *)0x15b5d3;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_b0 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_0015b5ff;
    if (extraout_RDX == 0) {
      pcStack_b8 = (code *)0x15b5f2;
      pcStack_b0._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_b0;
    }
  }
  else {
    pcStack_b8 = (code *)0x15b5ff;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b5ff:
    pcStack_b8 = (code *)0x15b604;
    getaddrinfo_fail_cb_cold_2();
  }
  pcStack_b8 = run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  pcStack_160 = (code *)0x15b616;
  pcStack_b8 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  pcStack_160 = (code *)0x15b630;
  iVar2 = uv_getaddrinfo(uVar3,auStack_158,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar2 < 0) {
    pcStack_160 = (code *)0x15b641;
    uv_freeaddrinfo(uStack_c8);
    pcStack_160 = (code *)0x15b646;
    unaff_RBX = uv_default_loop();
    pcStack_160 = (code *)0x15b65a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_160 = (code *)0x15b664;
    uv_run(unaff_RBX,0);
    pcStack_160 = (code *)0x15b669;
    uVar3 = uv_default_loop();
    pcStack_160 = (code *)0x15b671;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_160 = (code *)0x15b685;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  pcStack_160 = run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  pcStack_168 = (code *)0x15b695;
  pcStack_160 = (code *)unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  pcStack_168 = (code *)0x15b6a1;
  puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
  pcStack_168 = (code *)0x15b6c4;
  iVar2 = uv_getaddrinfo(puVar4,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar2 == 0) {
    pcStack_168 = (code *)0x15b6cd;
    puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_168 = (code *)0x15b6d7;
    uv_run(puVar4,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b71d;
    pcStack_168 = (code *)0x15b6e5;
    unaff_RBX = uv_default_loop();
    pcStack_168 = (code *)0x15b6f9;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_168 = (code *)0x15b703;
    uv_run(unaff_RBX,0);
    pcStack_168 = (code *)0x15b708;
    puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_168 = (code *)0x15b710;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_168 = (code *)0x15b71d;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b71d:
    pcStack_168 = (code *)0x15b722;
    run_test_getaddrinfo_basic_cold_2();
  }
  pcStack_168 = getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  pcStack_168 = (code *)unaff_RBX;
  if (getaddrinfo_handle == puVar4) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    pcStack_170 = (code *)0x15b73f;
    free(puVar4);
    iVar2 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar2;
  }
  pcStack_170 = run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  pcStack_170 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  iVar2 = uv_getaddrinfo(uVar3,auStack_210,0,"localhost",0,0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_180);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar4 = getaddrinfo_handles;
  piVar9 = callback_counts;
  lVar10 = 0;
  do {
    *piVar9 = 0;
    puVar8 = (undefined8 *)0x4;
    puVar5 = (undefined4 *)malloc(4);
    if (puVar5 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b8bc:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b8c1;
    }
    *puVar5 = (int)lVar10;
    puVar4->data = puVar5;
    puVar8 = (undefined8 *)uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar8,puVar4,getaddrinfo_cuncurrent_cb,"localhost",0,0,unaff_RBX);
    if (iVar2 != 0) goto LAB_0015b8bc;
    lVar10 = lVar10 + 1;
    puVar4 = puVar4 + 1;
    piVar9 = piVar9 + 1;
  } while (lVar10 != 10);
  puVar8 = (undefined8 *)uv_default_loop();
  lVar10 = 0;
  uv_run(puVar8,0);
  do {
    if (*(int *)((long)callback_counts + lVar10) != 1) goto LAB_0015b8c1;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x28);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  puVar8 = (undefined8 *)uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
LAB_0015b8c6:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar9 = (int *)*puVar8;
  piVar6 = callback_counts;
  psVar7 = &closedir_req.bufsml[1].len;
  lVar10 = 0;
  do {
    psVar7 = psVar7 + 0x14;
    if (psVar7 == puVar8) goto LAB_0015b903;
    piVar6 = piVar6 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar10 = extraout_RDX_02;
LAB_0015b903:
  if (*piVar9 == (int)lVar10) {
    *piVar6 = *piVar6 + 1;
    free(piVar9);
    iVar2 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar2;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(piVar9,0);
  return iVar2;
LAB_0015b8c1:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b8c6;
}

Assistant:

TEST_IMPL(getaddrinfo_fail) {
  uv_getaddrinfo_t req;

  ASSERT(UV_EINVAL == uv_getaddrinfo(uv_default_loop(),
                                     &req,
                                     (uv_getaddrinfo_cb) abort,
                                     NULL,
                                     NULL,
                                     NULL));

  /* Use a FQDN by ending in a period */
  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             getaddrinfo_fail_cb,
                             "xyzzy.xyzzy.xyzzy.",
                             NULL,
                             NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(fail_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}